

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::ClearGeometry
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  IMemoryAllocator *pIVar1;
  unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
  local_48;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *local_10;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_10 = this;
  if (this->m_pRawPtr != (void *)0x0) {
    pIVar1 = GetRawAllocator();
    (*pIVar1->_vptr_IMemoryAllocator[1])();
    this->m_pRawPtr = (void *)0x0;
  }
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).m_Desc.pTriangles = (BLASTriangleDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).m_Desc.TriangleCount = 0;
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).m_Desc.pBoxes = (BLASBoundingBoxDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  ).m_Desc.BoxCount = 0;
  memset(&local_48,0,0x38);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
  ::unordered_map(&local_48);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
  ::operator=(&this->m_NameToIndex,&local_48);
  std::
  unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
  ::~unordered_map(&local_48);
  return;
}

Assistant:

void ClearGeometry() noexcept
    {
        if (this->m_pRawPtr != nullptr)
        {
            GetRawAllocator().Free(this->m_pRawPtr);
            this->m_pRawPtr = nullptr;
        }

        // Keep Name, Flags, CompactedSize, ImmediateContextMask
        this->m_Desc.pTriangles    = nullptr;
        this->m_Desc.TriangleCount = 0;
        this->m_Desc.pBoxes        = nullptr;
        this->m_Desc.BoxCount      = 0;

        m_NameToIndex = decltype(m_NameToIndex){};
    }